

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O3

base_learner * oaa_setup(options_i *options,vw *all)

{
  uint64_t *initial;
  vw_ostream *pvVar1;
  uint32_t uVar2;
  namedlabels *pnVar3;
  uint32_t *puVar4;
  parser *ppVar5;
  vw *pvVar6;
  options_i *options_00;
  int iVar7;
  oaa *dat;
  option_group_definition *poVar8;
  polyprediction *ppVar9;
  uint *puVar10;
  ulong uVar11;
  ulong uVar12;
  base_learner *l;
  single_learner *base;
  learner<oaa,_example> *plVar13;
  undefined8 uVar14;
  ostream *poVar15;
  vw_exception *this;
  long lVar16;
  long lVar17;
  undefined **ppuVar18;
  label_parser *plVar19;
  uint64_t *location;
  byte bVar20;
  float fVar21;
  bool scores;
  bool probabilities;
  size_type __dnew_4;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_3;
  size_type __dnew_2;
  size_type __dnew_1;
  bool local_52a;
  bool local_529;
  vw *local_528;
  _func_int ***local_520;
  _func_int **local_518;
  _func_int **local_510 [2];
  options_i *local_500;
  long local_4f8;
  _func_int ***local_4f0;
  _func_int **local_4e8;
  _func_int **local_4e0 [2];
  _func_int ***local_4d0;
  _func_int **local_4c8;
  _func_int **local_4c0 [2];
  _func_int ***local_4b0;
  _func_int **local_4a8;
  _func_int **local_4a0 [2];
  string local_490;
  string local_470;
  option_group_definition local_450;
  long *local_418;
  long local_410;
  long local_408 [2];
  string local_3f8;
  string local_3d8;
  string local_3b8;
  undefined1 local_398 [48];
  string local_368 [64];
  bool local_328;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_310;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_300;
  undefined1 local_210 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  undefined1 local_170 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar20 = 0;
  local_500 = options;
  dat = calloc_or_throw<oaa>(1);
  dat->k = 0;
  dat->all = (vw *)0x0;
  dat->pred = (polyprediction *)0x0;
  dat->num_subsample = 0;
  dat->subsample_order = (uint32_t *)0x0;
  dat->subsample_id = 0;
  local_529 = false;
  local_52a = false;
  local_398._0_8_ = (_func_int **)0x17;
  local_520 = local_510;
  local_520 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_520,(ulong)local_398);
  local_510[0] = (_func_int **)local_398._0_8_;
  *(undefined4 *)local_520 = 0x20656e4f;
  builtin_strncpy((char *)((long)local_520 + 4),"Agai",4);
  *(undefined4 *)(local_520 + 1) = 0x2074736e;
  builtin_strncpy((char *)((long)local_520 + 0xc),"All ",4);
  builtin_strncpy((char *)((long)local_520 + 0xf)," Options",8);
  local_518 = (_func_int **)local_398._0_8_;
  *(char *)((long)local_520 + local_398._0_8_) = '\0';
  local_450.m_name._M_dataplus._M_p = (pointer)&local_450.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_450,local_520,(char *)(local_398._0_8_ + (long)local_520));
  local_450.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_450.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_450.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_520 != local_510) {
    operator_delete(local_520);
  }
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  local_470.field_2._M_allocated_capacity._0_4_ = 0x61616f;
  local_470._M_string_length = 3;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_398,&local_470,&dat->k);
  local_328 = true;
  local_4b0 = local_4a0;
  local_d0._0_8_ = (_func_int **)0x2a;
  local_4b0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_4b0,(ulong)local_d0);
  local_4a0[0] = (_func_int **)local_d0._0_8_;
  builtin_strncpy((char *)((long)local_4b0 + 0x1a)," with <k",8);
  builtin_strncpy((char *)((long)local_4b0 + 0x22),"> labels",8);
  local_4b0[2] = (_func_int **)0x616c6369746c756d;
  local_4b0[3] = (_func_int **)0x2068746977207373;
  *local_4b0 = (_func_int **)0x696167612d656e4f;
  local_4b0[1] = (_func_int **)0x206c6c612d74736e;
  local_4a8 = (_func_int **)local_d0._0_8_;
  *(char *)((long)local_4b0 + local_d0._0_8_) = '\0';
  std::__cxx11::string::_M_assign(local_368);
  poVar8 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (&local_450,(typed_option<unsigned_long> *)local_398);
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  local_490.field_2._M_allocated_capacity._0_5_ = 0x735f61616f;
  local_490.field_2._M_allocated_capacity._5_3_ = 0x736275;
  local_490.field_2._8_5_ = 0x656c706d61;
  local_490._M_string_length = 0xd;
  local_490.field_2._M_local_buf[0xd] = '\0';
  location = &dat->num_subsample;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_d0,&local_490,location);
  local_4d0 = local_4c0;
  local_170._0_8_ = (_func_int **)0x38;
  local_4d0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_4d0,(ulong)local_170);
  local_4c0[0] = (_func_int **)local_170._0_8_;
  local_4d0[4] = (_func_int **)0x6c706d6178652065;
  local_4d0[5] = (_func_int **)0x206e656877207365;
  local_4d0[2] = (_func_int **)0x666f207265626d75;
  local_4d0[3] = (_func_int **)0x7669746167656e20;
  *local_4d0 = (_func_int **)0x6c706d6173627573;
  local_4d0[1] = (_func_int **)0x6e20736968742065;
  local_4d0[6] = (_func_int **)0x676e696e7261656c;
  local_4c8 = (_func_int **)local_170._0_8_;
  *(char *)((long)local_4d0 + local_170._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  poVar8 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar8,(typed_option<unsigned_long> *)local_d0);
  local_3d8.field_2._M_allocated_capacity._0_5_ = 0x61626f7270;
  local_3d8.field_2._M_allocated_capacity._5_3_ = 0x6c6962;
  local_3d8.field_2._8_5_ = 0x7365697469;
  local_3d8._M_string_length = 0xd;
  local_3d8.field_2._M_local_buf[0xd] = '\0';
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_170,&local_3d8,&local_529);
  local_4f0 = local_4e0;
  local_210._0_8_ = (_func_int **)0x23;
  local_4f0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_4f0,(ulong)local_210);
  local_4e0[0] = (_func_int **)local_210._0_8_;
  local_4f0[2] = (_func_int **)0x20666f2073657469;
  local_4f0[3] = (_func_int **)0x73616c63206c6c61;
  *local_4f0 = (_func_int **)0x2074636964657270;
  local_4f0[1] = (_func_int **)0x6c696261626f7270;
  builtin_strncpy((char *)((long)local_4f0 + 0x1f),"sses",4);
  local_4e8 = (_func_int **)local_210._0_8_;
  *(char *)((long)local_4f0 + local_210._0_8_) = '\0';
  local_528 = all;
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  poVar8 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar8,(typed_option<bool> *)local_170);
  local_3f8.field_2._M_allocated_capacity._0_4_ = 0x726f6373;
  local_3f8.field_2._M_allocated_capacity._4_2_ = 0x7365;
  local_3f8._M_string_length = 6;
  local_3f8.field_2._M_local_buf[6] = '\0';
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_210,&local_3f8,&local_52a);
  local_4f8 = 0x1b;
  local_418 = local_408;
  local_418 = (long *)std::__cxx11::string::_M_create((ulong *)&local_418,(ulong)&local_4f8);
  local_408[0] = local_4f8;
  builtin_strncpy((char *)((long)local_418 + 0xb),"scores p",8);
  builtin_strncpy((char *)((long)local_418 + 0x13),"er class",8);
  *local_418 = 0x722074757074756f;
  local_418[1] = 0x65726f6373207761;
  local_410 = local_4f8;
  *(char *)((long)local_418 + local_4f8) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar8,(typed_option<bool> *)local_210);
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  local_210._0_8_ = &PTR__typed_option_002eaf88;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if (local_4f0 != local_4e0) {
    operator_delete(local_4f0);
  }
  local_170._0_8_ = &PTR__typed_option_002eaf88;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  options_00 = local_500;
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if (local_4d0 != local_4c0) {
    operator_delete(local_4d0);
  }
  local_d0._0_8_ = &PTR__typed_option_002eb060;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p);
  }
  if (local_4b0 != local_4a0) {
    operator_delete(local_4b0);
  }
  local_398._0_8_ = &PTR__typed_option_002eb060;
  if (local_300._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_300._M_pi);
  }
  if (local_310._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_310._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p);
  }
  (**options_00->_vptr_options_i)(options_00,&local_450);
  local_398._16_4_ = 0x61616f;
  local_398._8_8_ = (pointer)0x3;
  local_398._0_8_ = local_398 + 0x10;
  iVar7 = (*options_00->_vptr_options_i[1])(options_00,local_398);
  if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
    operator_delete((void *)local_398._0_8_);
  }
  if ((char)iVar7 == '\0') {
    plVar13 = (learner<oaa,_example> *)0x0;
  }
  else {
    pnVar3 = local_528->sd->ldict;
    if ((pnVar3 != (namedlabels *)0x0) && (dat->k != (ulong)pnVar3->K)) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_398);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_398 + 0x10),"error: you have ",0x10);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)(local_398 + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar15," named labels; use that as the argument to oaa",0x2e);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/oaa.cc"
                 ,0xdf,&local_3b8);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    dat->all = local_528;
    ppVar9 = calloc_or_throw<polyprediction>(dat->k);
    dat->pred = ppVar9;
    dat->subsample_order = (uint32_t *)0x0;
    dat->subsample_id = 0;
    if (dat->num_subsample != 0) {
      if (dat->num_subsample < dat->k) {
        puVar10 = calloc_or_throw<unsigned_int>(dat->k);
        dat->subsample_order = puVar10;
        if (dat->k != 0) {
          uVar11 = 0;
          do {
            dat->subsample_order[uVar11] = (uint32_t)uVar11;
            uVar11 = uVar11 + 1;
          } while (uVar11 < dat->k);
          if (dat->k != 0) {
            initial = &local_528->random_state;
            lVar17 = 0;
            uVar11 = 0;
            do {
              fVar21 = merand48(initial);
              fVar21 = fVar21 * (float)(dat->k + lVar17);
              uVar12 = (ulong)fVar21;
              lVar16 = ((long)(fVar21 - 9.223372e+18) & (long)uVar12 >> 0x3f | uVar12) + uVar11;
              puVar4 = dat->subsample_order;
              uVar2 = puVar4[uVar11];
              puVar4[uVar11] = puVar4[lVar16];
              dat->subsample_order[lVar16] = uVar2;
              uVar11 = uVar11 + 1;
              lVar17 = lVar17 + -1;
            } while (uVar11 < dat->k);
          }
        }
      }
      else {
        *location = 0;
        pvVar1 = &local_528->trace_message;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pvVar1->super_ostream,
                   "oaa is turning off subsampling because your parameter >= K",0x3a);
        std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
        std::ostream::put((char)pvVar1);
        std::ostream::flush();
      }
    }
    pvVar6 = local_528;
    l = setup_base(options_00,local_528);
    base = LEARNER::as_singleline<char,char>(l);
    if (local_529 == false) {
      if (local_52a == false) {
        ppVar5 = pvVar6->p;
        if (pvVar6->raw_prediction < 1) {
          plVar13 = LEARNER::learner<oaa,example>::init_learner<LEARNER::learner<char,example>>
                              (dat,base,predict_or_learn<true,false,false,false>,
                               predict_or_learn<false,false,false,false>,dat->k,multiclass);
        }
        else {
          plVar13 = LEARNER::learner<oaa,example>::init_learner<LEARNER::learner<char,example>>
                              (dat,base,predict_or_learn<true,true,false,false>,
                               predict_or_learn<false,true,false,false>,dat->k,multiclass);
        }
        *(undefined8 *)(plVar13 + 0x58) = *(undefined8 *)(plVar13 + 0x18);
        *(code **)(plVar13 + 0x68) = MULTICLASS::finish_example<oaa>;
        ppuVar18 = &MULTICLASS::mc_label;
        plVar19 = &ppVar5->lp;
        for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
          plVar19->default_label = (_func_void_void_ptr *)*ppuVar18;
          ppuVar18 = ppuVar18 + (ulong)bVar20 * -2 + 1;
          plVar19 = (label_parser *)((long)plVar19 + (ulong)bVar20 * -0x10 + 8);
        }
      }
      else {
        pvVar6->delete_prediction = delete_scalars;
        ppVar5 = pvVar6->p;
        plVar13 = LEARNER::learner<oaa,example>::init_learner<LEARNER::learner<char,example>>
                            (dat,base,predict_or_learn<true,false,true,false>,
                             predict_or_learn<false,false,true,false>,dat->k,scalars);
        ppuVar18 = &MULTICLASS::mc_label;
        plVar19 = &ppVar5->lp;
        for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
          plVar19->default_label = (_func_void_void_ptr *)*ppuVar18;
          ppuVar18 = ppuVar18 + (ulong)bVar20 * -2 + 1;
          plVar19 = (label_parser *)((long)plVar19 + (ulong)bVar20 * -0x10 + 8);
        }
        *(undefined8 *)(plVar13 + 0x58) = *(undefined8 *)(plVar13 + 0x18);
        *(code **)(plVar13 + 0x68) = finish_example_scores<false>;
      }
    }
    else {
      pvVar6->delete_prediction = delete_scalars;
      (**pvVar6->loss->_vptr_loss_function)(local_398);
      iVar7 = std::__cxx11::string::compare(local_398);
      if (iVar7 != 0) {
        pvVar1 = &pvVar6->trace_message;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pvVar1->super_ostream,
                   "WARNING: --probabilities should be used only with --loss_function=logistic",0x4a
                  );
        std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
        std::ostream::put((char)pvVar1);
        std::ostream::flush();
      }
      ppVar5 = pvVar6->p;
      plVar13 = LEARNER::learner<oaa,example>::init_learner<LEARNER::learner<char,example>>
                          (dat,base,predict_or_learn<true,false,true,true>,
                           predict_or_learn<false,false,true,true>,dat->k,scalars);
      *(undefined8 *)(plVar13 + 0x58) = *(undefined8 *)(plVar13 + 0x18);
      *(code **)(plVar13 + 0x68) = MULTICLASS::finish_example<oaa>;
      ppuVar18 = &MULTICLASS::mc_label;
      plVar19 = &ppVar5->lp;
      for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
        plVar19->default_label = (_func_void_void_ptr *)*ppuVar18;
        ppuVar18 = ppuVar18 + (ulong)bVar20 * -2 + 1;
        plVar19 = (label_parser *)((long)plVar19 + (ulong)bVar20 * -0x10 + 8);
      }
      pvVar6->sd->report_multiclass_log_loss = true;
      *(undefined8 *)(plVar13 + 0x58) = *(undefined8 *)(plVar13 + 0x18);
      *(code **)(plVar13 + 0x68) = finish_example_scores<true>;
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_);
      }
    }
    if (*location == 0) {
      uVar14 = *(undefined8 *)(plVar13 + 0x18);
    }
    else {
      *(code **)(plVar13 + 0x28) = learn_randomized;
      uVar14 = *(undefined8 *)(plVar13 + 0x18);
      *(undefined8 *)(plVar13 + 0x58) = uVar14;
      *(code **)(plVar13 + 0x68) = MULTICLASS::finish_example_without_loss<oaa>;
    }
    *(undefined8 *)(plVar13 + 0xb8) = uVar14;
    *(undefined8 *)(plVar13 + 0xc0) = *(undefined8 *)(plVar13 + 0x20);
    *(code **)(plVar13 + 200) = finish;
    dat = (oaa *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_450.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450.m_name._M_dataplus._M_p != &local_450.m_name.field_2) {
    operator_delete(local_450.m_name._M_dataplus._M_p);
  }
  if (dat != (oaa *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar13;
}

Assistant:

LEARNER::base_learner* oaa_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<oaa>();
  bool probabilities = false;
  bool scores = false;
  option_group_definition new_options("One Against All Options");
  new_options.add(make_option("oaa", data->k).keep().help("One-against-all multiclass with <k> labels"))
      .add(make_option("oaa_subsample", data->num_subsample)
               .help("subsample this number of negative examples when learning"))
      .add(make_option("probabilities", probabilities).help("predict probabilites of all classes"))
      .add(make_option("scores", scores).help("output raw scores per class"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("oaa"))
    return nullptr;

  if (all.sd->ldict && (data->k != all.sd->ldict->getK()))
    THROW("error: you have " << all.sd->ldict->getK() << " named labels; use that as the argument to oaa")

  data->all = &all;
  data->pred = calloc_or_throw<polyprediction>(data->k);
  data->subsample_order = nullptr;
  data->subsample_id = 0;
  if (data->num_subsample > 0)
  {
    if (data->num_subsample >= data->k)
    {
      data->num_subsample = 0;
      all.trace_message << "oaa is turning off subsampling because your parameter >= K" << endl;
    }
    else
    {
      data->subsample_order = calloc_or_throw<uint32_t>(data->k);
      for (size_t i = 0; i < data->k; i++) data->subsample_order[i] = (uint32_t)i;
      for (size_t i = 0; i < data->k; i++)
      {
        size_t j = (size_t)(merand48(all.random_state) * (float)(data->k - i)) + i;
        uint32_t tmp = data->subsample_order[i];
        data->subsample_order[i] = data->subsample_order[j];
        data->subsample_order[j] = tmp;
      }
    }
  }

  oaa* data_ptr = data.get();
  LEARNER::learner<oaa, example>* l;
  auto base = as_singleline(setup_base(options, all));
  if (probabilities || scores)
  {
    all.delete_prediction = delete_scalars;
    if (probabilities)
    {
      auto loss_function_type = all.loss->getType();
      if (loss_function_type != "logistic")
        all.trace_message << "WARNING: --probabilities should be used only with --loss_function=logistic" << endl;
      // the three boolean template parameters are: is_learn, print_all and scores
      l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, true, true>,
          predict_or_learn<false, false, true, true>, all.p, data->k, prediction_type::scalars);
      all.sd->report_multiclass_log_loss = true;
      l->set_finish_example(finish_example_scores<true>);
    }
    else
    {
      l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, true, false>,
          predict_or_learn<false, false, true, false>, all.p, data->k, prediction_type::scalars);
      l->set_finish_example(finish_example_scores<false>);
    }
  }
  else if (all.raw_prediction > 0)
    l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, true, false, false>,
        predict_or_learn<false, true, false, false>, all.p, data->k, prediction_type::multiclass);
  else
    l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, false, false>,
        predict_or_learn<false, false, false, false>, all.p, data->k, prediction_type::multiclass);

  if (data_ptr->num_subsample > 0) {
    l->set_learn(learn_randomized);
    l->set_finish_example(MULTICLASS::finish_example_without_loss<oaa>);
  }
  l->set_finish(finish);

  return make_base(*l);
}